

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O2

string * __thiscall
cmdline::parser::option_with_value<unsigned_int>::short_description_abi_cxx11_
          (string *__return_storage_ptr__,option_with_value<unsigned_int> *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_30,"--",&this->nam);
  std::operator+(&local_50,&local_30,"=");
  detail::readable_typename<unsigned_int>();
  std::operator+(__return_storage_ptr__,&local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string short_description() const {
            return "--" + nam + "=" + detail::readable_typename<T>();
        }